

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.h
# Opt level: O2

void __thiscall BloatyTest::CheckConsistency(BloatyTest *this,Options *options)

{
  int iVar1;
  Rep *pRVar2;
  long lVar3;
  AssertHelper *this_00;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  char *pcVar4;
  char *in_R9;
  void **ppvVar5;
  size_t total_input_size;
  AssertionResult gtest_ar_;
  int rows;
  undefined4 uStack_64;
  AssertionResult gtest_ar;
  AssertHelper local_40;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38;
  
  gtest_ar_.success_ = 0 < (options->base_filename_).super_RepeatedPtrFieldBase.current_size_;
  total_input_size =
       CONCAT71(total_input_size._1_7_,
                ((this->output_)._M_t.
                 super___uniq_ptr_impl<bloaty::RollupOutput,_std::default_delete<bloaty::RollupOutput>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_bloaty::RollupOutput_*,_std::default_delete<bloaty::RollupOutput>_>
                 .super__Head_base<0UL,_bloaty::RollupOutput_*,_false>._M_head_impl)->diff_mode_);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar,"options.base_filename_size() > 0","output_->diff_mode()",
             &gtest_ar_.success_,(bool *)&total_input_size);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = anon_var_dwarf_37602c + 0x11;
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&total_input_size,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/test.h",0x8d
               ,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&total_input_size,(Message *)&gtest_ar_);
    this_00 = (AssertHelper *)&total_input_size;
LAB_00176266:
    this_01 = &gtest_ar.message_;
    testing::internal::AssertHelper::~AssertHelper(this_00);
    if ((long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + 8))();
    }
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    if (((this->output_)._M_t.
         super___uniq_ptr_impl<bloaty::RollupOutput,_std::default_delete<bloaty::RollupOutput>_>.
         _M_t.
         super__Tuple_impl<0UL,_bloaty::RollupOutput_*,_std::default_delete<bloaty::RollupOutput>_>.
         super__Head_base<0UL,_bloaty::RollupOutput_*,_false>._M_head_impl)->diff_mode_ == false) {
      total_input_size = 0;
      pRVar2 = (options->filename_).super_RepeatedPtrFieldBase.rep_;
      ppvVar5 = pRVar2->elements;
      if (pRVar2 == (Rep *)0x0) {
        ppvVar5 = (void **)0x0;
      }
      iVar1 = (options->filename_).super_RepeatedPtrFieldBase.current_size_;
      this_01 = &gtest_ar_.message_;
      for (lVar3 = 0; (long)iVar1 * 8 != lVar3; lVar3 = lVar3 + 8) {
        gtest_ar_.success_ = GetFileSize(*(string **)((long)ppvVar5 + lVar3),(uint64_t *)&rows);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        if (!gtest_ar_.success_) {
          testing::Message::Message((Message *)&local_38);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar,(internal *)&gtest_ar_,
                     (AssertionResult *)"GetFileSize(filename, &size)","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_40,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/test.h"
                     ,0x93,(char *)CONCAT71(gtest_ar._1_7_,gtest_ar.success_));
          testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
          testing::internal::AssertHelper::~AssertHelper(&local_40);
          std::__cxx11::string::~string((string *)&gtest_ar);
          if (local_38._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl !=
              (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            (**(code **)(*(long *)local_38._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl + 8))();
          }
          goto LAB_0017642a;
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(this_01);
        total_input_size = total_input_size + CONCAT44(uStack_64,rows);
      }
      testing::internal::CmpHelperEQ<long,unsigned_long>
                ((internal *)&gtest_ar,"top_row_->size.file","total_input_size",
                 &(this->top_row_->size).file,&total_input_size);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&gtest_ar_);
        if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )gtest_ar.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl ==
            (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          pcVar4 = anon_var_dwarf_37602c + 0x11;
        }
        else {
          pcVar4 = *(char **)gtest_ar.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&rows,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/test.h",
                   0x96,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&rows,(Message *)&gtest_ar_);
        this_00 = (AssertHelper *)&rows;
        goto LAB_00176266;
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar.message_);
    }
    rows = 0;
    CheckConsistencyForRow
              (this,this->top_row_,true,
               ((this->output_)._M_t.
                super___uniq_ptr_impl<bloaty::RollupOutput,_std::default_delete<bloaty::RollupOutput>_>
                ._M_t.
                super__Tuple_impl<0UL,_bloaty::RollupOutput_*,_std::default_delete<bloaty::RollupOutput>_>
                .super__Head_base<0UL,_bloaty::RollupOutput_*,_false>._M_head_impl)->diff_mode_,
               &rows);
    CheckCSVConsistency(this,rows);
    testing::internal::CmpHelperEQ<char[6],std::__cxx11::string>
              ((internal *)&gtest_ar,"\"TOTAL\"","top_row_->name",(char (*) [6])"TOTAL",
               &this->top_row_->name);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar4 = anon_var_dwarf_37602c + 0x11;
      }
      else {
        pcVar4 = *(char **)gtest_ar.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&total_input_size,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/tests/test.h",
                 0x9c,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&total_input_size,(Message *)&gtest_ar_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&total_input_size);
      if ((long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(gtest_ar_._1_7_,gtest_ar_.success_) + 8))();
      }
    }
    this_01 = &gtest_ar.message_;
  }
LAB_0017642a:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(this_01);
  return;
}

Assistant:

void CheckConsistency(const bloaty::Options& options) {
    ASSERT_EQ(options.base_filename_size() > 0, output_->diff_mode());

    if (!output_->diff_mode()) {
      size_t total_input_size = 0;
      for (const auto& filename : options.filename()) {
        uint64_t size;
        ASSERT_TRUE(GetFileSize(filename, &size));
        total_input_size += size;
      }
      ASSERT_EQ(top_row_->size.file, total_input_size);
    }

    int rows = 0;
    CheckConsistencyForRow(*top_row_, true, output_->diff_mode(), &rows);
    CheckCSVConsistency(rows);
    ASSERT_EQ("TOTAL", top_row_->name);
  }